

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

int anon_unknown.dwarf_651c7::MyItem::CompareWithSortSpecs(void *lhs,void *rhs)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  plVar2 = (anonymous_namespace)::MyItem::s_current_sort_specs;
  uVar5 = 0;
  uVar4 = (ulong)*(uint *)((anonymous_namespace)::MyItem::s_current_sort_specs + 1);
  if ((int)*(uint *)((anonymous_namespace)::MyItem::s_current_sort_specs + 1) < 1) {
    uVar4 = uVar5;
  }
  while( true ) {
    if (uVar4 * 0xc - uVar5 == 0) {
      return *lhs - *rhs;
    }
    lVar1 = *plVar2;
    switch(*(undefined4 *)(lVar1 + uVar5)) {
    case 0:
      iVar3 = *lhs - *rhs;
      break;
    case 1:
    case 4:
      iVar3 = strcmp(*(char **)((long)lhs + 8),*(char **)((long)rhs + 8));
      break;
    default:
      goto switchD_001435db_caseD_2;
    case 3:
      iVar3 = *(int *)((long)lhs + 0x10) - *(int *)((long)rhs + 0x10);
    }
    if (0 < iVar3) break;
    if (iVar3 < 0) {
      bVar6 = *(char *)(lVar1 + 8 + uVar5) != '\x01';
      goto LAB_0014362d;
    }
switchD_001435db_caseD_2:
    uVar5 = uVar5 + 0xc;
  }
  bVar6 = *(char *)(lVar1 + 8 + uVar5) == '\x01';
LAB_0014362d:
  return (uint)bVar6 * 2 + -1;
}

Assistant:

CompareWithSortSpecs(const void* lhs, const void* rhs)
    {
        const MyItem* a = (const MyItem*)lhs;
        const MyItem* b = (const MyItem*)rhs;
        for (int n = 0; n < s_current_sort_specs->SpecsCount; n++)
        {
            // Here we identify columns using the ColumnUserID value that we ourselves passed to TableSetupColumn()
            // We could also choose to identify columns based on their index (sort_spec->ColumnIndex), which is simpler!
            const ImGuiTableColumnSortSpecs* sort_spec = &s_current_sort_specs->Specs[n];
            int delta = 0;
            switch (sort_spec->ColumnUserID)
            {
            case MyItemColumnID_ID:             delta = (a->ID - b->ID);                break;
            case MyItemColumnID_Name:           delta = (strcmp(a->Name, b->Name));     break;
            case MyItemColumnID_Quantity:       delta = (a->Quantity - b->Quantity);    break;
            case MyItemColumnID_Description:    delta = (strcmp(a->Name, b->Name));     break;
            default: IM_ASSERT(0); break;
            }
            if (delta > 0)
                return (sort_spec->SortDirection == ImGuiSortDirection_Ascending) ? +1 : -1;
            if (delta < 0)
                return (sort_spec->SortDirection == ImGuiSortDirection_Ascending) ? -1 : +1;
        }

        // qsort() is instable so always return a way to differenciate items.
        // Your own compare function may want to avoid fallback on implicit sort specs e.g. a Name compare if it wasn't already part of the sort specs.
        return (a->ID - b->ID);
    }